

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

bool __thiscall units::detail::unit_data::hasValidRoot(unit_data *this,int power)

{
  undefined1 local_15;
  int power_local;
  unit_data *this_local;
  
  local_15 = false;
  if (((((((((int)*this << 0x1c) >> 0x1c) % power == 0) &&
         (local_15 = false, (((int)*this << 0x18) >> 0x1c) % power == 0)) &&
        (local_15 = false, (((int)*this << 0x15) >> 0x1d) % power == 0)) &&
       ((local_15 = false, (((int)*this << 0x12) >> 0x1d) % power == 0 &&
        (local_15 = false, (((int)*this << 0x10) >> 0x1e) % power == 0)))) &&
      ((local_15 = false, (((int)*this << 0xd) >> 0x1d) % power == 0 &&
       ((local_15 = false, (((int)*this << 0xb) >> 0x1e) % power == 0 &&
        (local_15 = false, (((int)*this << 8) >> 0x1d) % power == 0)))))) &&
     ((local_15 = false, (((int)*this << 6) >> 0x1e) % power == 0 &&
      (local_15 = false, (((int)*this << 4) >> 0x1e) % power == 0)))) {
    local_15 = -1 < (int)*this;
  }
  return local_15;
}

Assistant:

constexpr bool hasValidRoot(int power) const
        {
            return meter_ % power == 0 && second_ % power == 0 &&
                kilogram_ % power == 0 && ampere_ % power == 0 &&
                candela_ % power == 0 && kelvin_ % power == 0 &&
                mole_ % power == 0 && radians_ % power == 0 &&
                currency_ % power == 0 && count_ % power == 0 &&
                equation_ == 0U;
        }